

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeMeshes.cpp
# Opt level: O0

bool __thiscall Assimp::OptimizeMeshesProcess::IsActive(OptimizeMeshesProcess *this,uint pFlags)

{
  uint local_2c;
  uint pFlags_local;
  OptimizeMeshesProcess *this_local;
  
  if ((pFlags & 0x200000) == 0) {
    this_local._7_1_ = false;
  }
  else {
    this->pts = (pFlags & 0x8000) != 0;
    if ((pFlags & 0x80) == 0) {
      local_2c = this->max_verts;
    }
    else {
      local_2c = 0xdeadbeef;
    }
    this->max_verts = local_2c;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool OptimizeMeshesProcess::IsActive( unsigned int pFlags) const
{
    // Our behaviour needs to be different if the SortByPType or SplitLargeMeshes
    // steps are active. Thus we need to query their flags here and store the
    // information, although we're breaking const-correctness.
    // That's a serious design flaw, consider redesign.
    if( 0 != (pFlags & aiProcess_OptimizeMeshes) ) {
        pts = (0 != (pFlags & aiProcess_SortByPType));
        max_verts = ( 0 != ( pFlags & aiProcess_SplitLargeMeshes ) ) ? DeadBeef : max_verts;
        return true;
    }
    return false;
}